

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCtrlSelectTargetNotify(Display *dpy,int target_type,int target_id,int notify_type,int onoff)

{
  XExtDisplayInfo *pXVar1;
  undefined1 *puVar2;
  xnvCtrlSelectTargetNotifyReq *req;
  XExtDisplayInfo *info;
  int onoff_local;
  int notify_type_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  pXVar1 = find_display(dpy);
  if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar2 = (undefined1 *)_XGetRequest(dpy,0x17,0xc);
    *puVar2 = (char)pXVar1->codes->major_opcode;
    puVar2[1] = 0x17;
    *(short *)(puVar2 + 4) = (short)target_type;
    *(short *)(puVar2 + 6) = (short)target_id;
    *(short *)(puVar2 + 8) = (short)notify_type;
    *(short *)(puVar2 + 10) = (short)onoff;
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->unlock_display)(dpy);
    }
    if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
      (*dpy->synchandler)(dpy);
    }
    dpy_local._4_4_ = 1;
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCtrlSelectTargetNotify (
    Display *dpy,
    int target_type,
    int target_id,
    int notify_type,
    Bool onoff
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSelectTargetNotifyReq *req;

    if(!XextHasExtension (info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlSelectTargetNotify, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSelectTargetNotify;
    req->target_type = target_type;
    req->target_id = target_id;
    req->notifyType = notify_type;
    req->onoff = onoff;
    UnlockDisplay (dpy);
    SyncHandle ();

    return True;
}